

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_predictor_8x16_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  short sVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  unkuint9 Var11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [13];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  uint8_t *puVar19;
  ushort uVar20;
  byte bVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined2 uVar28;
  undefined2 uVar29;
  undefined1 auVar27 [16];
  uint uVar30;
  uint uVar33;
  uint uVar34;
  undefined1 auVar31 [16];
  uint uVar35;
  __m128i d;
  __m128i rep;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  uint uVar41;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar32 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar49 [16];
  undefined1 auVar54 [16];
  undefined1 auVar50 [16];
  undefined1 auVar55 [16];
  undefined1 auVar51 [16];
  undefined1 auVar56 [16];
  
  auVar17 = _DAT_0050d960;
  auVar16 = _DAT_0050d950;
  auVar21 = pshuflw(ZEXT116(left[0xf]),ZEXT116(left[0xf]),0);
  uVar1 = *(ulong *)above;
  bVar23 = (byte)(uVar1 >> 0x38);
  auVar3._8_6_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xe] = bVar23;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xc] = (char)(uVar1 >> 0x30);
  auVar4._13_2_ = auVar3._13_2_;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5._12_3_ = auVar4._12_3_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[10] = (char)(uVar1 >> 0x28);
  auVar6._11_4_ = auVar5._11_4_;
  auVar7._8_2_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7._10_5_ = auVar6._10_5_;
  auVar8[8] = (char)(uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar8._9_6_ = auVar7._9_6_;
  auVar10._7_8_ = 0;
  auVar10._0_7_ = auVar8._8_7_;
  Var11 = CONCAT81(SUB158(auVar10 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar14._9_6_ = 0;
  auVar14._0_9_ = Var11;
  auVar12._1_10_ = SUB1510(auVar14 << 0x30,5);
  auVar12[0] = (char)(uVar1 >> 0x10);
  auVar15._11_4_ = 0;
  auVar15._0_11_ = auVar12;
  auVar13._1_12_ = SUB1512(auVar15 << 0x20,3);
  auVar13[0] = (char)(uVar1 >> 8);
  uVar20 = CONCAT11(0,(byte)uVar1);
  auVar9._2_13_ = auVar13;
  auVar9._0_2_ = uVar20;
  uVar29 = auVar21._2_2_;
  auVar26._0_12_ = auVar9._0_12_;
  auVar26._12_2_ = (short)Var11;
  auVar26._14_2_ = uVar29;
  auVar25._12_4_ = auVar26._12_4_;
  auVar25._0_10_ = auVar9._0_10_;
  uVar28 = auVar21._0_2_;
  auVar25._10_2_ = uVar28;
  auVar24._10_6_ = auVar25._10_6_;
  auVar24._8_2_ = auVar12._0_2_;
  auVar24._6_2_ = uVar29;
  auVar24._4_2_ = auVar13._0_2_;
  auVar24._2_2_ = uVar28;
  auVar24._0_2_ = uVar20;
  auVar22._2_2_ = uVar28;
  auVar22._0_2_ = auVar8._8_2_;
  auVar22._4_2_ = auVar6._10_2_;
  auVar22._6_2_ = uVar29;
  auVar22._8_2_ = auVar4._12_2_;
  auVar22._10_2_ = uVar28;
  auVar22[0xc] = bVar23;
  auVar22[0xd] = 0;
  auVar22._14_2_ = uVar29;
  auVar27 = pshuflw(ZEXT116(bVar23),ZEXT116(bVar23),0);
  auVar21 = *(undefined1 (*) [16])left;
  iVar18 = 8;
  puVar19 = dst;
  auVar25 = _DAT_0050d850;
  auVar26 = _DAT_004d29e0;
  do {
    auVar47 = pshufb(_DAT_0050d8e0,auVar25);
    auVar57 = pshufb(_DAT_0050d8f0,auVar25);
    auVar51._0_12_ = auVar47._0_12_;
    auVar51._12_2_ = auVar47._6_2_;
    auVar51._14_2_ = auVar57._6_2_;
    auVar50._12_4_ = auVar51._12_4_;
    auVar50._0_10_ = auVar47._0_10_;
    auVar50._10_2_ = auVar57._4_2_;
    auVar49._10_6_ = auVar50._10_6_;
    auVar49._0_8_ = auVar47._0_8_;
    auVar49._8_2_ = auVar47._4_2_;
    auVar48._8_8_ = auVar49._8_8_;
    auVar48._6_2_ = auVar57._2_2_;
    auVar48._4_2_ = auVar47._2_2_;
    auVar48._0_2_ = auVar47._0_2_;
    auVar48._2_2_ = auVar57._0_2_;
    auVar58 = pmaddwd(auVar24,auVar48);
    auVar47 = pshufb(auVar21,auVar26);
    uVar29 = auVar27._2_2_;
    auVar32._0_12_ = auVar47._0_12_;
    auVar32._12_2_ = auVar47._6_2_;
    auVar32._14_2_ = uVar29;
    uVar28 = auVar27._0_2_;
    auVar31._12_4_ = auVar32._12_4_;
    auVar31._0_10_ = auVar47._0_10_;
    auVar31._10_2_ = uVar28;
    auVar52._10_6_ = auVar31._10_6_;
    auVar52._0_8_ = auVar47._0_8_;
    auVar52._8_2_ = auVar47._4_2_;
    auVar57._8_8_ = auVar52._8_8_;
    auVar57._6_2_ = uVar29;
    auVar57._4_2_ = auVar47._2_2_;
    auVar57._0_2_ = auVar47._0_2_;
    auVar57._2_2_ = uVar28;
    auVar47 = pmaddwd(auVar57,auVar16);
    uVar41 = auVar47._0_4_ + 0x100 + auVar58._0_4_;
    uVar44 = auVar47._4_4_ + 0x100 + auVar58._4_4_;
    uVar45 = auVar47._8_4_ + 0x100 + auVar58._8_4_;
    uVar46 = auVar47._12_4_ + 0x100 + auVar58._12_4_;
    auVar52 = pmaddwd(auVar48,auVar22);
    auVar47 = pmaddwd(auVar57,auVar17);
    uVar30 = auVar47._0_4_ + 0x100 + auVar52._0_4_;
    uVar33 = auVar47._4_4_ + 0x100 + auVar52._4_4_;
    uVar34 = auVar47._8_4_ + 0x100 + auVar52._8_4_;
    uVar35 = auVar47._12_4_ + 0x100 + auVar52._12_4_;
    sVar2 = (short)(uVar41 >> 9);
    uVar20 = (ushort)(uVar41 >> 0x19);
    auVar42[1] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar41 >> 0x19) - (0xff < uVar20);
    auVar42[0] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar41 >> 9) - (0xff < sVar2);
    sVar2 = (short)(uVar44 >> 9);
    auVar42[2] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar44 >> 9) - (0xff < sVar2);
    uVar20 = (ushort)(uVar44 >> 0x19);
    auVar42[3] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar44 >> 0x19) - (0xff < uVar20);
    sVar2 = (short)(uVar45 >> 9);
    auVar42[4] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar45 >> 9) - (0xff < sVar2);
    uVar20 = (ushort)(uVar45 >> 0x19);
    auVar42[5] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar45 >> 0x19) - (0xff < uVar20);
    sVar2 = (short)(uVar46 >> 9);
    auVar42[6] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar46 >> 9) - (0xff < sVar2);
    uVar20 = (ushort)(uVar46 >> 0x19);
    auVar42[7] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar46 >> 0x19) - (0xff < uVar20);
    sVar2 = (short)(uVar30 >> 9);
    auVar42[8] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar30 >> 9) - (0xff < sVar2);
    uVar20 = (ushort)(uVar30 >> 0x19);
    auVar42[9] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar30 >> 0x19) - (0xff < uVar20);
    sVar2 = (short)(uVar33 >> 9);
    auVar42[10] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar33 >> 9) - (0xff < sVar2);
    uVar20 = (ushort)(uVar33 >> 0x19);
    auVar42[0xb] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar33 >> 0x19) - (0xff < uVar20);
    sVar2 = (short)(uVar34 >> 9);
    auVar42[0xc] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar34 >> 9) - (0xff < sVar2);
    uVar20 = (ushort)(uVar34 >> 0x19);
    auVar42[0xd] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar34 >> 0x19) - (0xff < uVar20);
    sVar2 = (short)(uVar35 >> 9);
    auVar42[0xe] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar35 >> 9) - (0xff < sVar2);
    uVar20 = (ushort)(uVar35 >> 0x19);
    auVar42[0xf] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar35 >> 0x19) - (0xff < uVar20);
    auVar47 = pshufb(auVar42,ZEXT816(0xe0c0a0806040200));
    *(long *)puVar19 = auVar47._0_8_;
    puVar19 = puVar19 + stride;
    auVar58._0_2_ = auVar26._0_2_ + 1;
    auVar58._2_2_ = auVar26._2_2_ + 1;
    auVar58._4_2_ = auVar26._4_2_ + 1;
    auVar58._6_2_ = auVar26._6_2_ + 1;
    auVar58._8_2_ = auVar26._8_2_ + 1;
    auVar58._10_2_ = auVar26._10_2_ + 1;
    auVar58._12_2_ = auVar26._12_2_ + 1;
    auVar58._14_2_ = auVar26._14_2_ + 1;
    auVar47._0_2_ = auVar25._0_2_ + 0x202;
    auVar47._2_2_ = auVar25._2_2_ + 0x202;
    auVar47._4_2_ = auVar25._4_2_ + 0x202;
    auVar47._6_2_ = auVar25._6_2_ + 0x202;
    auVar47._8_2_ = auVar25._8_2_ + 0x202;
    auVar47._10_2_ = auVar25._10_2_ + 0x202;
    auVar47._12_2_ = auVar25._12_2_ + 0x202;
    auVar47._14_2_ = auVar25._14_2_ + 0x202;
    iVar18 = iVar18 + -1;
    auVar25 = auVar47;
    auVar26 = auVar58;
  } while (iVar18 != 0);
  puVar19 = dst + stride * 8;
  iVar18 = 8;
  auVar25 = _DAT_0050d850;
  auVar26 = _DAT_0050d900;
  do {
    auVar27 = pshufb(_DAT_0050d910,auVar25);
    auVar47 = pshufb(_DAT_0050d920,auVar25);
    auVar56._0_12_ = auVar27._0_12_;
    auVar56._12_2_ = auVar27._6_2_;
    auVar56._14_2_ = auVar47._6_2_;
    auVar55._12_4_ = auVar56._12_4_;
    auVar55._0_10_ = auVar27._0_10_;
    auVar55._10_2_ = auVar47._4_2_;
    auVar54._10_6_ = auVar55._10_6_;
    auVar54._0_8_ = auVar27._0_8_;
    auVar54._8_2_ = auVar27._4_2_;
    auVar53._8_8_ = auVar54._8_8_;
    auVar53._6_2_ = auVar47._2_2_;
    auVar53._4_2_ = auVar27._2_2_;
    auVar53._0_2_ = auVar27._0_2_;
    auVar53._2_2_ = auVar47._0_2_;
    auVar47 = pmaddwd(auVar24,auVar53);
    auVar27 = pshufb(auVar21,auVar26);
    auVar40._0_12_ = auVar27._0_12_;
    auVar40._12_2_ = auVar27._6_2_;
    auVar40._14_2_ = uVar29;
    auVar39._12_4_ = auVar40._12_4_;
    auVar39._0_10_ = auVar27._0_10_;
    auVar39._10_2_ = uVar28;
    auVar38._10_6_ = auVar39._10_6_;
    auVar38._0_8_ = auVar27._0_8_;
    auVar38._8_2_ = auVar27._4_2_;
    auVar37._8_8_ = auVar38._8_8_;
    auVar37._6_2_ = uVar29;
    auVar37._4_2_ = auVar27._2_2_;
    auVar37._0_2_ = auVar27._0_2_;
    auVar37._2_2_ = uVar28;
    auVar27 = pmaddwd(auVar37,auVar16);
    uVar41 = auVar27._0_4_ + 0x100 + auVar47._0_4_;
    uVar44 = auVar27._4_4_ + 0x100 + auVar47._4_4_;
    uVar45 = auVar27._8_4_ + 0x100 + auVar47._8_4_;
    uVar46 = auVar27._12_4_ + 0x100 + auVar47._12_4_;
    auVar47 = pmaddwd(auVar53,auVar22);
    auVar27 = pmaddwd(auVar37,auVar17);
    uVar30 = auVar27._0_4_ + 0x100 + auVar47._0_4_;
    uVar33 = auVar27._4_4_ + 0x100 + auVar47._4_4_;
    uVar34 = auVar27._8_4_ + 0x100 + auVar47._8_4_;
    uVar35 = auVar27._12_4_ + 0x100 + auVar47._12_4_;
    sVar2 = (short)(uVar41 >> 9);
    uVar20 = (ushort)(uVar41 >> 0x19);
    auVar43[1] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar41 >> 0x19) - (0xff < uVar20);
    auVar43[0] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar41 >> 9) - (0xff < sVar2);
    sVar2 = (short)(uVar44 >> 9);
    auVar43[2] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar44 >> 9) - (0xff < sVar2);
    uVar20 = (ushort)(uVar44 >> 0x19);
    auVar43[3] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar44 >> 0x19) - (0xff < uVar20);
    sVar2 = (short)(uVar45 >> 9);
    auVar43[4] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar45 >> 9) - (0xff < sVar2);
    uVar20 = (ushort)(uVar45 >> 0x19);
    auVar43[5] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar45 >> 0x19) - (0xff < uVar20);
    sVar2 = (short)(uVar46 >> 9);
    auVar43[6] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar46 >> 9) - (0xff < sVar2);
    uVar20 = (ushort)(uVar46 >> 0x19);
    auVar43[7] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar46 >> 0x19) - (0xff < uVar20);
    sVar2 = (short)(uVar30 >> 9);
    auVar43[8] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar30 >> 9) - (0xff < sVar2);
    uVar20 = (ushort)(uVar30 >> 0x19);
    auVar43[9] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar30 >> 0x19) - (0xff < uVar20);
    sVar2 = (short)(uVar33 >> 9);
    auVar43[10] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar33 >> 9) - (0xff < sVar2);
    uVar20 = (ushort)(uVar33 >> 0x19);
    auVar43[0xb] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar33 >> 0x19) - (0xff < uVar20);
    sVar2 = (short)(uVar34 >> 9);
    auVar43[0xc] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar34 >> 9) - (0xff < sVar2);
    uVar20 = (ushort)(uVar34 >> 0x19);
    auVar43[0xd] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar34 >> 0x19) - (0xff < uVar20);
    sVar2 = (short)(uVar35 >> 9);
    auVar43[0xe] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar35 >> 9) - (0xff < sVar2);
    uVar20 = (ushort)(uVar35 >> 0x19);
    auVar43[0xf] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar35 >> 0x19) - (0xff < uVar20);
    auVar27 = pshufb(auVar43,ZEXT816(0xe0c0a0806040200));
    *(long *)puVar19 = auVar27._0_8_;
    puVar19 = puVar19 + stride;
    auVar36._0_2_ = auVar26._0_2_ + 1;
    auVar36._2_2_ = auVar26._2_2_ + 1;
    auVar36._4_2_ = auVar26._4_2_ + 1;
    auVar36._6_2_ = auVar26._6_2_ + 1;
    auVar36._8_2_ = auVar26._8_2_ + 1;
    auVar36._10_2_ = auVar26._10_2_ + 1;
    auVar36._12_2_ = auVar26._12_2_ + 1;
    auVar36._14_2_ = auVar26._14_2_ + 1;
    auVar27._0_2_ = auVar25._0_2_ + 0x202;
    auVar27._2_2_ = auVar25._2_2_ + 0x202;
    auVar27._4_2_ = auVar25._4_2_ + 0x202;
    auVar27._6_2_ = auVar25._6_2_ + 0x202;
    auVar27._8_2_ = auVar25._8_2_ + 0x202;
    auVar27._10_2_ = auVar25._10_2_ + 0x202;
    auVar27._12_2_ = auVar25._12_2_ + 0x202;
    auVar27._14_2_ = auVar25._14_2_ + 0x202;
    iVar18 = iVar18 + -1;
    auVar25 = auVar27;
    auVar26 = auVar36;
  } while (iVar18 != 0);
  return;
}

Assistant:

static inline void load_pixel_w8(const uint8_t *above, const uint8_t *left,
                                 int height, __m128i *pixels) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bp = _mm_set1_epi16((int16_t)left[height - 1]);
  __m128i d = _mm_loadl_epi64((const __m128i *)above);
  d = _mm_unpacklo_epi8(d, zero);
  pixels[0] = _mm_unpacklo_epi16(d, bp);
  pixels[1] = _mm_unpackhi_epi16(d, bp);

  pixels[3] = _mm_set1_epi16((int16_t)above[7]);

  if (height == 4) {
    pixels[2] = _mm_cvtsi32_si128(((const int *)left)[0]);
  } else if (height == 8) {
    pixels[2] = _mm_loadl_epi64((const __m128i *)left);
  } else if (height == 16) {
    pixels[2] = _mm_load_si128((const __m128i *)left);
  } else {
    pixels[2] = _mm_load_si128((const __m128i *)left);
    pixels[4] = pixels[0];
    pixels[5] = pixels[1];
    pixels[6] = _mm_load_si128((const __m128i *)(left + 16));
    pixels[7] = pixels[3];
  }
}